

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vec3f * barycentric(vec3f *__return_storage_ptr__,vec3i A,vec3i B,vec3i C,vec3i P)

{
  int iVar1;
  int *piVar2;
  double *pdVar3;
  int iVar4;
  vec<3UL,_double> *this;
  double extraout_XMM0_Qa;
  vec<3UL,_double> *local_a0;
  undefined1 local_98 [8];
  vec3f u;
  undefined1 local_78 [4];
  int i;
  vec3f s [2];
  undefined1 local_30 [8];
  vec3i B_local;
  undefined1 local_14 [8];
  vec3i A_local;
  
  B_local.x = B.z;
  local_30 = B._0_8_;
  A_local.x = A.z;
  B_local._4_8_ = A._0_8_;
  local_a0 = (vec<3UL,_double> *)local_78;
  local_14 = (undefined1  [8])B_local._4_8_;
  do {
    vec<3UL,_double>::vec(local_a0);
    local_a0 = local_a0 + 1;
  } while (local_a0 != (vec<3UL,_double> *)&s[1].z);
  u.z._4_4_ = 2;
  while (iVar4 = u.z._4_4_ + -1, u.z._4_4_ != 0) {
    u.z._4_4_ = iVar4;
    piVar2 = vec<3UL,_int>::operator[](&C,(long)iVar4);
    iVar4 = *piVar2;
    piVar2 = vec<3UL,_int>::operator[]((vec<3UL,_int> *)local_14,(long)u.z._4_4_);
    iVar1 = *piVar2;
    pdVar3 = vec<3UL,_double>::operator[]((vec<3UL,_double> *)(local_78 + (long)u.z._4_4_ * 0x18),0)
    ;
    *pdVar3 = (double)(iVar4 - iVar1);
    piVar2 = vec<3UL,_int>::operator[]((vec<3UL,_int> *)local_30,(long)u.z._4_4_);
    iVar4 = *piVar2;
    piVar2 = vec<3UL,_int>::operator[]((vec<3UL,_int> *)local_14,(long)u.z._4_4_);
    iVar1 = *piVar2;
    pdVar3 = vec<3UL,_double>::operator[]((vec<3UL,_double> *)(local_78 + (long)u.z._4_4_ * 0x18),1)
    ;
    *pdVar3 = (double)(iVar4 - iVar1);
    piVar2 = vec<3UL,_int>::operator[]((vec<3UL,_int> *)local_14,(long)u.z._4_4_);
    iVar4 = *piVar2;
    piVar2 = vec<3UL,_int>::operator[](&P,(long)u.z._4_4_);
    iVar1 = *piVar2;
    pdVar3 = vec<3UL,_double>::operator[]((vec<3UL,_double> *)(local_78 + (long)u.z._4_4_ * 0x18),2)
    ;
    *pdVar3 = (double)(iVar4 - iVar1);
  }
  u.z._4_4_ = iVar4;
  cross((vec3f *)local_98,(vec3f *)local_78,(vec3f *)&s[0].z);
  this = (vec<3UL,_double> *)local_98;
  vec<3UL,_double>::operator[](this,2);
  std::abs((int)this);
  if (extraout_XMM0_Qa <= 0.01) {
    vec<3UL,_double>::vec(__return_storage_ptr__,-1.0,1.0,1.0);
  }
  else {
    vec<3UL,_double>::vec
              (__return_storage_ptr__,1.0 - ((double)local_98 + u.x) / u.y,u.x / u.y,
               (double)local_98 / u.y);
  }
  return __return_storage_ptr__;
}

Assistant:

vec3f barycentric(vec3i A, vec3i B, vec3i C, vec3i P)
{
    vec3f s[2];
    for (int i = 2; i--;) {
        s[i][0] = static_cast<double>(C[i] - A[i]);
        s[i][1] = static_cast<double>(B[i] - A[i]);
        s[i][2] = static_cast<double>(A[i] - P[i]);
    }
    vec3f u = cross(s[0], s[1]);
    if (std::abs(u[2]) >
        1e-2)  // dont forget that u[2] is integer. If it is zero then triangle ABC is degenerate
        return vec3f(1.f - (u.x + u.y) / u.z, u.y / u.z, u.x / u.z);
    return vec3f(-1, 1, 1);  // in this case generate negative coordinates, it will be thrown away
                             // by the rasterizer
}